

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O3

string * __thiscall
cpptrace::microfmt::detail::format<4ul,char_const*>
          (string *__return_storage_ptr__,detail *this,char *fmt_begin,char *fmt_end,
          array<cpptrace::microfmt::detail::format_value,_4UL> args)

{
  detail dVar1;
  detail *pdVar2;
  bool bVar3;
  detail dVar4;
  char *saved_it;
  char *it;
  detail *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_class_16_2_dcdac0d9 local_98;
  size_t local_88;
  detail *local_80;
  anon_class_16_2_b3e63829 local_78;
  anon_class_56_7_8906807c local_68;
  
  local_98.it = (char **)&local_a8;
  local_78.it = (char **)&local_a8;
  local_a0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88 = 0;
  if (this != (detail *)fmt_begin) {
    local_a8 = this;
    local_98.fmt_end = (char **)&local_80;
    local_80 = (detail *)fmt_begin;
    local_78.fmt_end = (char **)&local_80;
    do {
      pdVar2 = local_a8;
      dVar1 = *local_a8;
      if ((dVar1 == (detail)0x7d) || (dVar1 == (detail)0x7b)) {
        if ((long)*local_98.fmt_end - (long)*local_98.it < 2) {
          dVar4 = (detail)0x0;
        }
        else {
          dVar4 = *(detail *)(*local_98.it + 1);
        }
        if (dVar4 != dVar1) goto LAB_0017735e;
        pdVar2 = local_a8 + 1;
LAB_001773b6:
        local_a8 = pdVar2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,(char)*local_a8);
      }
      else {
LAB_0017735e:
        if (local_a8 + 1 == local_80 || dVar1 != (detail)0x7b) goto LAB_001773b6;
        local_68.read_number = &local_78;
        local_68.peek = &local_98;
        local_68.args = &args;
        local_68.it = (char **)&local_a8;
        local_68.fmt_end = (char **)&local_80;
        local_68.arg_i = &local_88;
        local_68.str = __return_storage_ptr__;
        bVar3 = format<4UL,_const_char_*>::anon_class_56_7_8906807c::operator()(&local_68);
        if (!bVar3) goto LAB_001773b6;
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format(It fmt_begin, It fmt_end, std::array<format_value, N> args) {
            std::string str;
            std::size_t arg_i = 0;
            auto it = fmt_begin;
            auto peek = [&] (std::size_t dist) -> char { // 0 on failure
                return fmt_end - it > signed(dist) ? *(it + dist) : 0;
            };
            auto read_number = [&] () -> int { // -1 on failure
                auto scan = it;
                int num = 0;
                while(scan != fmt_end && isdigit(*scan)) {
                    num *= 10;
                    num += *scan - '0';
                    scan++;
                }
                if(scan != it) {
                    it = scan;
                    return num;
                } else {
                    return -1;
                }
            };
            for(; it != fmt_end; it++) {
                if((*it == '{' || *it == '}') && peek(1) == *it) { // parse {{ and }} escapes
                    it++;
                } else if(*it == '{' && it + 1 != fmt_end) {
                    auto saved_it = it;
                    auto handle_formatter = [&] () {
                        it++;
                        format_options options;
                        // try to parse alignment
                        if(*it == '<' || *it == '>') {
                            options.align = *it++ == '<' ? alignment::left : alignment::right;
                        }
                        // try to parse width
                        auto width = read_number(); // handles fmt_end check
                        if(width != -1) {
                            options.width = width;
                        } else if(it != fmt_end && *it == '{') { // try to parse variable width
                            if(peek(1) != '}') {
                                return false;
                            }
                            it += 2;
                            options.width = arg_i < args.size() ? args[arg_i++].unwrap_int() : 0;
                        }
                        // try to parse fill/base
                        if(it != fmt_end && *it == ':') {
                            it++;
                            if(fmt_end - it > 1 && *it != '}' && peek(1) != '}') { // two chars before the }, fill+base
                                options.fill = *it++;
                                options.base = *it++;
                            } else if(it != fmt_end && *it != '}') { // one char before the }, just base
                                if(*it == 'd' || *it == 'h' || *it == 'H' || *it == 'o' || *it == 'b') {
                                    options.base = *it++;
                                } else {
                                    options.fill = *it++;
                                }
                            }
                        }
                        if(it == fmt_end || *it != '}') {
                            return false;
                        }
                        if(arg_i < args.size()) {
                            args[arg_i++].write(str, options);
                        }
                        return true;
                    };
                    if(handle_formatter()) {
                        continue; // If reached here, successfully parsed and wrote a formatter. Don't write *it.
                    }
                    it = saved_it; // go back
                }
                str += *it;
            }
            return str;
        }